

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteIndexSamples(sqlite3 *db,Index *pIdx)

{
  IndexSample *p;
  int j;
  Index *pIdx_local;
  sqlite3 *db_local;
  
  if (pIdx->aSample != (IndexSample *)0x0) {
    for (p._4_4_ = 0; p._4_4_ < pIdx->nSample; p._4_4_ = p._4_4_ + 1) {
      sqlite3DbFree(db,pIdx->aSample[p._4_4_].p);
    }
    sqlite3DbFree(db,pIdx->aSample);
  }
  if ((db != (sqlite3 *)0x0) && (db->pnBytesFreed == (int *)0x0)) {
    pIdx->nSample = 0;
    pIdx->aSample = (IndexSample *)0x0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteIndexSamples(sqlite3 *db, Index *pIdx){
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pIdx->aSample ){
    int j;
    for(j=0; j<pIdx->nSample; j++){
      IndexSample *p = &pIdx->aSample[j];
      sqlite3DbFree(db, p->p);
    }
    sqlite3DbFree(db, pIdx->aSample);
  }
  if( db && db->pnBytesFreed==0 ){
    pIdx->nSample = 0;
    pIdx->aSample = 0;
  }
#else
  UNUSED_PARAMETER(db);
  UNUSED_PARAMETER(pIdx);
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */
}